

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack11_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  uVar2 = *(ulong *)in;
  auVar7._8_4_ = 0x7ff;
  auVar7._0_8_ = 0x7ff000007ff;
  auVar7._12_4_ = 0x7ff;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar2;
  auVar6 = vpshufd_avx(auVar6,0x50);
  auVar4 = vpsrlvd_avx2(auVar6,_DAT_001a0820);
  *out = (uint)uVar2 & 0x7ff;
  uVar5 = (uint)(uVar2 >> 0x20);
  auVar3 = vpinsrd_avx(auVar7,(uVar5 & 1) << 10,1);
  uVar1 = in[2];
  auVar6 = vpand_avx(auVar4,auVar7);
  auVar3 = vpor_avx(auVar4,auVar3);
  auVar6 = vpblendd_avx2(auVar6,auVar3,2);
  *(undefined1 (*) [16])(out + 1) = auVar6;
  auVar6 = vpbroadcastd_avx512vl();
  auVar6 = vpsrlvd_avx2(auVar6,_DAT_001951c0);
  out[5] = uVar5 >> 0x17 | (uVar1 & 3) << 9;
  auVar6 = vpand_avx(auVar6,auVar7);
  *(long *)(out + 6) = auVar6._0_8_;
  return in + 3;
}

Assistant:

const uint32_t *__fastunpack11_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 11);
  out++;
  *out = ((*in) >> 11) % (1U << 11);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 1)) << (11 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 11);
  out++;
  *out = ((*in) >> 12) % (1U << 11);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 2)) << (11 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 11);
  out++;
  *out = ((*in) >> 13) % (1U << 11);
  out++;

  return in + 1;
}